

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::logStackBacktrace(SimpleLoggerMgr *this,size_t timeout_ms)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  long in_RDI;
  RawStackInfo *entry_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_> *__range1_1;
  RawStackInfo *entry;
  iterator __end1;
  iterator __begin1;
  vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_> *__range1;
  char time_fmt [64];
  string path;
  char filename [128];
  int tz_gap_abs;
  int tz_gap;
  TimeInfo lt;
  undefined1 in_stack_0000066f;
  SimpleLoggerMgr *in_stack_00000670;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  RawStackInfo *in_stack_fffffffffffffe18;
  SimpleLoggerMgr *in_stack_fffffffffffffe20;
  TimeInfo *in_stack_fffffffffffffe38;
  time_point in_stack_fffffffffffffe40;
  int local_1b4;
  __normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
  local_198;
  long local_190;
  reference local_188;
  RawStackInfo *local_180;
  __normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
  local_178;
  SimpleLoggerMgr *in_stack_fffffffffffffe90;
  char local_168 [80];
  string local_118 [32];
  string local_f8 [32];
  char local_d8 [128];
  int local_58;
  int local_54;
  undefined8 local_50;
  uint local_48;
  uint local_44;
  uint local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (uVar2 = std::ofstream::is_open(), (uVar2 & 1) == 0)) {
    local_50 = std::chrono::_V2::system_clock::now();
    TimeInfo::TimeInfo(in_stack_fffffffffffffe38,in_stack_fffffffffffffe40);
    local_54 = getTzGap();
    local_1b4 = local_54;
    if (local_54 < 0) {
      local_1b4 = -local_54;
    }
    local_58 = local_1b4;
    local_1b4 = local_1b4 % 0x3c;
    uVar4 = local_38;
    uVar5 = local_34;
    snprintf(local_d8,0x80,"dump_%04d%02d%02d_%02d%02d%02d%c%02d%02d.txt",(ulong)local_48,
             (ulong)local_44,(ulong)local_40);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                   (char *)CONCAT44(in_stack_fffffffffffffe04,local_1b4));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdec,uVar5),
                   (char *)CONCAT44(in_stack_fffffffffffffde4,uVar4));
    std::__cxx11::string::~string(local_118);
    std::ofstream::open((string *)(in_RDI + 0x228),(_Ios_Openmode)local_f8);
    snprintf(local_168,0x40,"%04d-%02d-%02dT%02d:%02d:%02d.%03d%03d%c%02d:%02d",(ulong)local_48,
             (ulong)local_44,(ulong)local_40);
    poVar3 = std::operator<<((ostream *)(in_RDI + 0x228),"When: ");
    in_stack_fffffffffffffe20 = (SimpleLoggerMgr *)std::operator<<(poVar3,local_168);
    in_stack_fffffffffffffe18 =
         (RawStackInfo *)
         std::ostream::operator<<(in_stack_fffffffffffffe20,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(in_stack_fffffffffffffe18,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_f8);
    in_stack_fffffffffffffdd8 = local_3c;
    in_stack_fffffffffffffde0 = local_38;
    in_stack_fffffffffffffde8 = local_34;
    in_stack_fffffffffffffdf0 = local_30;
  }
  flushCriticalInfo(in_stack_fffffffffffffe90);
  addRawStackInfo(in_stack_00000670,(bool)in_stack_0000066f);
  logStackBackTraceOtherThreads((SimpleLoggerMgr *)filename._0_8_);
  local_178._M_current =
       (RawStackInfo *)
       std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
       begin((vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
              *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  local_180 = (RawStackInfo *)
              std::
              vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
              ::end((vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
                     *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
                             *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            (__normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
                             *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)), bVar1
        ) {
    local_188 = __gnu_cxx::
                __normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
                ::operator*(&local_178);
    flushRawStack(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    __gnu_cxx::
    __normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
    ::operator++(&local_178);
  }
  local_190 = in_RDI + 0x438;
  local_198._M_current =
       (RawStackInfo *)
       std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::
       begin((vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
              *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>::end
            ((vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>
              *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
                             *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                            (__normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
                             *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
    ::operator*(&local_198);
    flushStackTraceBuffer
              ((SimpleLoggerMgr *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (RawStackInfo *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    __gnu_cxx::
    __normal_iterator<SimpleLoggerMgr::RawStackInfo_*,_std::vector<SimpleLoggerMgr::RawStackInfo,_std::allocator<SimpleLoggerMgr::RawStackInfo>_>_>
    ::operator++(&local_198);
  }
  return;
}

Assistant:

void SimpleLoggerMgr::logStackBacktrace(size_t timeout_ms) {
    // Set abort timeout: 60 seconds.
    abortTimer = timeout_ms;

    if (!crashDumpPath.empty() && !crashDumpFile.is_open()) {
        // Open crash dump file.
        TimeInfo lt( std::chrono::system_clock::now() );
        int tz_gap = getTzGap();
        int tz_gap_abs = (tz_gap < 0) ? (tz_gap * -1) : (tz_gap);

        char filename[128];
        snprintf(filename, 128, "dump_%04d%02d%02d_%02d%02d%02d%c%02d%02d.txt",
                lt.year, lt.month, lt.day,
                lt.hour, lt.min, lt.sec,
                (tz_gap >= 0) ? '+' : '-',
                (int)(tz_gap_abs / 60), tz_gap_abs % 60);
        std::string path = crashDumpPath + "/" + filename;
        crashDumpFile.open(path);

        char time_fmt[64];
        snprintf(time_fmt, 64, "%04d-%02d-%02dT%02d:%02d:%02d.%03d%03d%c%02d:%02d",
                lt.year, lt.month, lt.day,
                lt.hour, lt.min, lt.sec, lt.msec, lt.usec,
                (tz_gap >= 0) ? '+' : '-',
                (int)(tz_gap_abs / 60), tz_gap_abs % 60);
        crashDumpFile << "When: " << time_fmt << std::endl << std::endl;
    }

    flushCriticalInfo();
    addRawStackInfo(true);
    // Collect other threads' stack info.
    logStackBackTraceOtherThreads();

    // Now print out.
    // For the case where `addr2line` is hanging, flush raw pointer first.
    for (RawStackInfo& entry: crashDumpThreadStacks) {
        flushRawStack(entry);
    }
    for (RawStackInfo& entry: crashDumpThreadStacks) {
        flushStackTraceBuffer(entry);
    }
}